

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O1

void __thiscall
duckdb::WindowBoundariesState::ValidBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  ulong r;
  bool bVar3;
  reference pvVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t n;
  optional_ptr<duckdb::WindowCursor,_true> local_50;
  data_ptr_t local_48;
  data_ptr_t local_40;
  idx_t local_38;
  
  local_50.ptr = range.ptr;
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
  local_40 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
  local_48 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&bounds->data,4);
  if (count != 0) {
    pdVar1 = pvVar4->data;
    iVar6 = 0;
    do {
      if (((partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
           [row_idx + iVar6 >> 6] >> (row_idx + iVar6 & 0x3f) & 1) != 0 || is_jump) {
        uVar2 = *(ulong *)(local_40 + iVar6 * 8);
        this->valid_start = uVar2;
        r = *(ulong *)(local_48 + iVar6 * 8);
        if ((uVar2 < r) && (this->has_preceding_range == true)) {
          optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&local_50);
          bVar3 = WindowCursor::CellIsNull(local_50.ptr,0,this->valid_start);
          if (bVar3) {
            local_38 = 1;
            iVar5 = FindNextStart(order_mask,this->valid_start + 1,r,&local_38);
            this->valid_start = iVar5;
          }
        }
      }
      *(idx_t *)(pdVar1 + iVar6 * 8) = this->valid_start;
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  return;
}

Assistant:

void WindowBoundariesState::ValidBegin(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                       const ValidityMask &partition_mask, const ValidityMask &order_mask,
                                       optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_END]);
	auto valid_begin_data = FlatVector::GetData<idx_t>(bounds.data[VALID_BEGIN]);

	//	OVER()
	D_ASSERT(partition_count + order_count != 0);
	D_ASSERT(range);

	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);

		if (!is_same_partition || is_jump) {
			// Find valid ordering values for the new partition
			// so we can exclude NULLs from RANGE expression computations
			valid_start = partition_begin_data[chunk_idx];
			const auto valid_end = partition_end_data[chunk_idx];

			if ((valid_start < valid_end) && has_preceding_range) {
				// Exclude any leading NULLs
				if (range->CellIsNull(0, valid_start)) {
					idx_t n = 1;
					valid_start = FindNextStart(order_mask, valid_start + 1, valid_end, n);
				}
			}
		}

		valid_begin_data[chunk_idx] = valid_start;
	}
}